

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

void __thiscall
booster::locale::basic_message<wchar_t>::basic_message
          (basic_message<wchar_t> *this,string_type *context,string_type *id)

{
  wstring *in_RDX;
  wstring *in_RSI;
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 2) = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  *(undefined8 *)(in_RDI + 6) = 0;
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 8),in_RDX);
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 0x10),in_RSI);
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 0x18));
  return;
}

Assistant:

explicit basic_message(string_type const &context,string_type const &id) :
                n_(0),
                c_id_(0),
                c_context_(0),
                c_plural_(0),
                id_(id),
                context_(context)
            {
            }